

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

void AdditionHelper<unsigned_long,_short,_8>::
     AdditionThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (unsigned_long *lhs,short *rhs,unsigned_long *result)

{
  uint32_t uVar1;
  ulong uVar2;
  unsigned_long uVar3;
  
  uVar2 = (ulong)*rhs;
  if ((long)uVar2 < 0) {
    uVar1 = AbsValueHelper<short,_0>::Abs(*rhs);
    uVar3 = *lhs - (ulong)uVar1;
    if (*lhs < (ulong)uVar1) goto LAB_0013adb0;
  }
  else {
    uVar3 = uVar2 + *lhs;
    if (CARRY8(uVar2,*lhs)) {
LAB_0013adb0:
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
    }
  }
  *result = uVar3;
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void AdditionThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // lhs is std::uint64_t, rhs signed
        std::uint64_t tmp = 0;

        if( rhs < 0 )
        {
            // So we're effectively subtracting
            tmp = AbsValueHelper< U, GetAbsMethod< U >::method >::Abs( rhs );

            if( tmp <= lhs )
            {
                result = lhs - tmp;
                return;
            }
        }
        else
        {
            // now we know that rhs can be safely cast into an std::uint64_t
            tmp = (std::uint64_t)lhs + (std::uint64_t)rhs;

            // We added and it did not become smaller
            if( tmp >= lhs )
            {
                result = (T)tmp;
                return;
            }
        }

        E::SafeIntOnOverflow();
    }